

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JavascriptOperators.cpp
# Opt level: O3

bool Js::JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties
               (RecyclableObject *object)

{
  JavascriptLibrary *pJVar1;
  bool bVar2;
  PrototypeChainCache<Js::NoSpecialPropertyCache> *local_28;
  
  pJVar1 = (((object->type).ptr)->javascriptLibrary).ptr;
  Memory::Recycler::WBSetBit((char *)&local_28);
  local_28 = &pJVar1->typesWithNoSpecialPropertyProtoChain;
  Memory::RecyclerWriteBarrierManager::WriteBarrier(&local_28);
  bVar2 = PrototypeChainCache<Js::NoSpecialPropertyCache>::Check(local_28,object);
  return bVar2;
}

Assistant:

bool JavascriptOperators::CheckIfObjectAndProtoChainHasNoSpecialProperties(_In_ RecyclableObject* object)
    {
        return object->GetLibrary()->GetTypesWithNoSpecialPropertyProtoChainCache()->Check(object);
    }